

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O3

int __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::stat
          (summary_impl<unsigned_long,_6UL> *this,char *__file,stat *__buf)

{
  double dVar1;
  ushort uVar2;
  uint uVar3;
  data_t *this_00;
  data_t *this_01;
  ulong uVar4;
  void *pvVar5;
  uint uVar6;
  long *in_RCX;
  long lVar7;
  double *pdVar8;
  iterator __position;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float v;
  data_copy_t data_copy;
  undefined8 local_b0;
  int local_a4;
  long *local_a0;
  undefined1 local_98 [24];
  undefined1 auStack_80 [32];
  uint local_60;
  double *local_50;
  double local_48;
  double dStack_40;
  
  refresh((summary_impl<unsigned_long,_6UL> *)__file);
  *in_RCX = 0;
  __buf->st_dev = 0;
  auStack_80._24_4_ = 0;
  auStack_80._28_4_ = 0;
  auStack_80._8_8_ = (pointer)0x0;
  auStack_80._16_8_ = (pointer)0x0;
  local_98._16_8_ = (pointer)0x0;
  auStack_80._0_8_ = (pointer)0x0;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  this_00 = *(data_t **)(__file + 0x18);
  this_01 = *(data_t **)(__file + 0x20);
  if (this_01 == (data_t *)0x0 && this_00 == (data_t *)0x0) {
    local_b0 = local_b0 & 0xffffffff00000000;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this,
               (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3,
               (value_type_conflict4 *)&local_b0,(allocator_type *)&local_a4);
    goto LAB_001689f4;
  }
  local_a0 = in_RCX;
  if (this_00 != (data_t *)0x0) {
    data_t::stat(this_00,(char *)in_RCX,(stat *)local_98);
  }
  if (this_01 != (data_t *)0x0) {
    data_t::stat(this_01,(char *)local_a0,(stat *)auStack_80);
  }
  if (*local_a0 == 0) {
    local_b0 = (ulong)local_b0._4_4_ << 0x20;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this,
               (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3,
               (value_type_conflict4 *)&local_b0,(allocator_type *)&local_a4);
    goto LAB_001689f4;
  }
  local_b0 = 0x2000;
  local_a4 = 0;
  std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
  emplace_back<unsigned_long,int>
            ((vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>
              *)local_98,&local_b0,&local_a4);
  local_b0 = 0x2000;
  local_a4 = 0;
  std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
  emplace_back<unsigned_long,int>
            ((vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>
              *)auStack_80,&local_b0,&local_a4);
  bVar10 = *(short *)local_98._0_8_ < *(short *)auStack_80._0_8_;
  if (*(short *)local_98._0_8_ == *(short *)auStack_80._0_8_) {
    local_60 = 0;
    bVar10 = *(unsigned_long *)(local_98._0_8_ + 8) < *(unsigned_long *)(auStack_80._0_8_ + 8);
    if (*(unsigned_long *)(local_98._0_8_ + 8) != *(unsigned_long *)(auStack_80._0_8_ + 8))
    goto LAB_0016871d;
  }
  else {
LAB_0016871d:
    local_60 = (uint)(bVar10 ^ 1);
  }
  (this->refresh_time_).__r = 0;
  (this->tp_).super___atomic_base<unsigned_long>._M_i = 0;
  this->rate_ = (vector<double,_std::allocator<double>_> *)0x0;
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)this,
             (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3);
  local_b0 = CONCAT44(local_b0._4_4_,0xdf800000);
  pdVar8 = (double *)**(undefined8 **)(__file + 0x10);
  local_50 = (double *)(*(undefined8 **)(__file + 0x10))[1];
  if (pdVar8 != local_50) {
    lVar9 = 0;
    do {
      dVar1 = *pdVar8;
      if (0.0 <= dVar1) {
        lVar7 = *local_a0;
        auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar13._0_8_ = lVar7;
        auVar13._12_4_ = 0x45300000;
        dStack_40 = auVar13._8_8_ - 1.9342813113834067e+25;
        local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
        if (dVar1 <= 1.0) {
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            if (dVar1 * local_48 <= local_48) {
              local_48 = dVar1 * local_48;
            }
          }
          else {
            dStack_40 = 0.0;
            local_48 = 1.0;
            if (lVar7 == 0) {
              dStack_40 = 0.0;
              local_48 = 0.0;
            }
          }
        }
        auVar11._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar11._0_8_ = lVar9;
        auVar11._12_4_ = 0x45300000;
        if ((auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) < local_48) {
          do {
            uVar4 = *(ulong *)(*(long *)(local_98 + (long)(int)local_60 * 0x18) + 8 +
                              (long)*(int *)(auStack_80 + (long)(int)local_60 * 4 + 0x18) * 0x10);
            uVar3 = *(uint *)(*(long *)(local_98 + (long)(int)local_60 * 0x18) +
                             (long)*(int *)(auStack_80 + (long)(int)local_60 * 4 + 0x18) * 0x10);
            uVar6 = 0x1fff - uVar3;
            if (-1 < (short)uVar3) {
              uVar6 = uVar3;
            }
            local_b0 = CONCAT44(local_b0._4_4_,
                                *(float *)(summary_impl<unsigned_long,6ul>::get_decode_table()::
                                           table + ((ulong)uVar6 & 0xffff) * 4));
            lVar9 = lVar9 + uVar4;
            __buf->st_dev =
                 (__dev_t)((double)(*(float *)(summary_impl<unsigned_long,6ul>::get_decode_table()::
                                               table + ((ulong)uVar6 & 0xffff) * 4) * (float)uVar4)
                          + (double)__buf->st_dev);
            data_copy_t::inc((data_copy_t *)local_98);
            auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
            auVar12._0_8_ = lVar9;
            auVar12._12_4_ = 0x45300000;
          } while ((auVar12._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) < local_48);
        }
        __position._M_current = (float *)(this->tp_).super___atomic_base<unsigned_long>._M_i;
        if ((vector<double,_std::allocator<double>_> *)__position._M_current != this->rate_)
        goto LAB_001688f1;
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)this,__position,(float *)&local_b0);
      }
      else {
        __position._M_current = (float *)(this->tp_).super___atomic_base<unsigned_long>._M_i;
        if ((vector<double,_std::allocator<double>_> *)__position._M_current == this->rate_) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this,__position,(float *)&local_b0);
        }
        else {
LAB_001688f1:
          *__position._M_current = (float)local_b0;
          (this->tp_).super___atomic_base<unsigned_long>._M_i =
               (__int_type_conflict)(__position._M_current + 1);
        }
      }
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != local_50);
  }
  lVar7 = (long)*(int *)(auStack_80 + (long)(int)local_60 * 4 + 0x18);
  lVar9 = *(long *)(local_98 + (long)(int)local_60 * 0x18);
  uVar2 = *(ushort *)(lVar9 + lVar7 * 0x10);
  if (uVar2 < 0x2000) {
    do {
      __buf->st_dev =
           (__dev_t)((double)((float)*(ulong *)(lVar9 + 8 + lVar7 * 0x10) *
                             *(float *)(summary_impl<unsigned_long,6ul>::get_decode_table()::table +
                                       (ulong)uVar2 * 4)) + (double)__buf->st_dev);
      data_copy_t::inc((data_copy_t *)local_98);
      lVar7 = (long)*(int *)(auStack_80 + (long)(int)local_60 * 4 + 0x18);
      lVar9 = *(long *)(local_98 + (long)(int)local_60 * 0x18);
      uVar2 = *(ushort *)(lVar9 + lVar7 * 0x10);
    } while (uVar2 < 0x2000);
  }
LAB_001689f4:
  lVar9 = 0x30;
  do {
    pvVar5 = *(void **)((long)&local_b0 + lVar9);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,*(long *)((long)&local_a0 + lVar9) - (long)pvVar5);
    }
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != 0);
  return (int)this;
}

Assistant:

std::vector<float> stat(double& sum, uint64_t& count) {
    refresh();
    count = 0;
    sum = 0;
    data_copy_t data_copy;
    {
      data_t* ar[2] = {data_[0], data_[1]};
      if (ar[0] == nullptr && ar[1] == nullptr) [[unlikely]] {
        return std::vector<float>(rate_.size(), 0.0f);
      }
      if (ar[0]) {
        ar[0]->stat(count, data_copy.arr[0]);
      }
      if (ar[1]) {
        ar[1]->stat(count, data_copy.arr[1]);
      }
    }
    if (count == 0) {
      return std::vector<float>(rate_.size(), 0);
    }
    uint64_t count_now = 0;
    data_copy.arr[0].emplace_back(bucket_size / 2, 0);
    data_copy.arr[1].emplace_back(bucket_size / 2, 0);
    data_copy.init();
    std::vector<float> result;
    result.reserve(rate_.size());
    float v = -float16_max;
    for (double e : rate_) {
      if (std::isnan(e) || e < 0) {
        result.push_back(v);
        continue;
      }
      else if (e > 1) [[unlikely]] {
        e = 1;
      }
      auto target_count = std::min<double>(e * count, count);
      if (e == 0) {
        target_count = std::min(uint64_t{1}, count);
      }
      while (true) {
        if (target_count <= count_now) [[unlikely]] {
          result.push_back(v);
          break;
        }
        auto tmp = data_copy.count();
        count_now += tmp;
        v = decode(data_t::get_raw_index(data_copy.value()));
        sum += v * tmp;
        data_copy.inc();
      }
    }
    while (data_copy.value() < bucket_size / 2) {
      sum +=
          decode(data_t::get_raw_index(data_copy.value())) * data_copy.count();
      data_copy.inc();
    }
    return result;
  }